

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XMLException.cpp
# Opt level: O1

void __thiscall
xercesc_4_0::XMLException::loadExceptText
          (XMLException *this,Codes toLoad,XMLCh *text1,XMLCh *text2,XMLCh *text3,XMLCh *text4)

{
  short *psVar1;
  MemoryManager *pMVar2;
  char cVar3;
  int iVar4;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 in_register_00000034;
  XMLCh *__src;
  size_t __n;
  XMLCh errText [4096];
  XMLCh *__dest;
  
  this->fCode = toLoad;
  cVar3 = (**(code **)(*sMsgLoader + 0x18))
                    (sMsgLoader,CONCAT44(in_register_00000034,toLoad),errText,0xfff,text1,text2,
                     text3,text4,this->fMemoryManager);
  __src = errText;
  pMVar2 = this->fMemoryManager;
  __n = 0;
  if (cVar3 == '\0') {
    do {
      psVar1 = (short *)((long)&XMLUni::fgDefErrMsg + __n);
      __n = __n + 2;
    } while (*psVar1 != 0);
    iVar4 = (*pMVar2->_vptr_MemoryManager[3])(pMVar2,__n);
    __dest = (XMLCh *)CONCAT44(extraout_var_00,iVar4);
    __src = &XMLUni::fgDefErrMsg;
  }
  else {
    do {
      psVar1 = (short *)((long)errText + __n);
      __n = __n + 2;
    } while (*psVar1 != 0);
    iVar4 = (*pMVar2->_vptr_MemoryManager[3])(pMVar2,__n);
    __dest = (XMLCh *)CONCAT44(extraout_var,iVar4);
  }
  memcpy(__dest,__src,__n);
  this->fMsg = __dest;
  return;
}

Assistant:

void
XMLException::loadExceptText(const  XMLExcepts::Codes toLoad
                            , const XMLCh* const        text1
                            , const XMLCh* const        text2
                            , const XMLCh* const        text3
                            , const XMLCh* const        text4)
{
    // Store the error code
    fCode = toLoad;

    // Load up the text into a local buffer
    const XMLSize_t msgSize = 4095;
    XMLCh errText[msgSize + 1];

    // load the text
	if (!gGetMsgLoader().loadMsg(toLoad, errText, msgSize, text1, text2, text3, text4, fMemoryManager))
	{
		fMsg = XMLString::replicate
        (
        XMLUni::fgDefErrMsg
            , fMemoryManager
        );
		return;
	}

    // We got the text so replicate it into the message member
    fMsg = XMLString::replicate(errText, fMemoryManager);
}